

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int log_series_cdf_inv(double cdf,double a)

{
  double dVar1;
  int local_2c;
  int xmax;
  int x;
  double pdf;
  double cdf2;
  double a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    local_2c = 1;
    for (pdf = 0.0; pdf < cdf && local_2c < 1000; pdf = pdf + _xmax) {
      if (local_2c == 1) {
        dVar1 = log(1.0 - a);
        _xmax = -a / dVar1;
      }
      else {
        _xmax = ((double)(local_2c + -1) * a * _xmax) / (double)local_2c;
      }
      local_2c = local_2c + 1;
    }
    return local_2c;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"LOG_SERIES_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int log_series_cdf_inv ( double cdf, double a )

//****************************************************************************80
//
//  Purpose:
//
//    LOG_SERIES_CDF_INV inverts the Logarithmic Series CDF.
//
//  Discussion:
//
//    Simple summation is used.  The only protection against an
//    infinite loop caused by roundoff is that X cannot be larger
//    than 1000.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, the parameter of the PDF.
//    0.0 < A < 1.0.
//
//    Output, double LOG_SERIES_CDF_INV, the argument X of the CDF for which
//    CDF(X-1) <= CDF <= CDF(X).
//
{
  double cdf2;
  double pdf;
  int x;
  int xmax = 1000;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "LOG_SERIES_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  cdf2 = 0.0;
  x = 1;

  while ( cdf2 < cdf && x < xmax )
  {
    if ( x == 1 )
    {
      pdf = - a / log ( 1.0 - a );
    }
    else
    {
      pdf = static_cast<double>(x - 1 ) * a * pdf / static_cast<double>(x );
    }

    cdf2 = cdf2 + pdf;

    x = x + 1;
  }
  return x;
}